

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactQuantizedBvh.cpp
# Opt level: O1

void __thiscall
cbtQuantizedBvhTree::build_tree(cbtQuantizedBvhTree *this,GIM_BVH_DATA_ARRAY *primitive_boxes)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  int iVar4;
  BT_QUANTIZED_BVH_NODE *ptr;
  undefined8 uVar5;
  BT_QUANTIZED_BVH_NODE *pBVar6;
  long lVar7;
  long lVar8;
  int *piVar9;
  int iVar10;
  
  calc_quantization(this,primitive_boxes,1.0);
  this->m_num_nodes = 0;
  iVar3 = (primitive_boxes->super_cbtAlignedObjectArray<GIM_BVH_DATA>).m_size;
  iVar10 = iVar3 * 2;
  iVar4 = (this->m_node_array).super_cbtAlignedObjectArray<BT_QUANTIZED_BVH_NODE>.m_size;
  if ((iVar4 <= iVar10) && (iVar4 < iVar10)) {
    if ((this->m_node_array).super_cbtAlignedObjectArray<BT_QUANTIZED_BVH_NODE>.m_capacity < iVar10)
    {
      if (iVar3 == 0) {
        pBVar6 = (BT_QUANTIZED_BVH_NODE *)0x0;
      }
      else {
        pBVar6 = (BT_QUANTIZED_BVH_NODE *)cbtAlignedAllocInternal((long)iVar3 << 5,0x10);
      }
      lVar7 = (long)(this->m_node_array).super_cbtAlignedObjectArray<BT_QUANTIZED_BVH_NODE>.m_size;
      if (0 < lVar7) {
        lVar8 = 0;
        do {
          puVar1 = (undefined8 *)
                   ((long)((this->m_node_array).super_cbtAlignedObjectArray<BT_QUANTIZED_BVH_NODE>.
                          m_data)->m_quantizedAabbMin + lVar8);
          uVar5 = puVar1[1];
          puVar2 = (undefined8 *)((long)pBVar6->m_quantizedAabbMin + lVar8);
          *puVar2 = *puVar1;
          puVar2[1] = uVar5;
          lVar8 = lVar8 + 0x10;
        } while (lVar7 * 0x10 != lVar8);
      }
      ptr = (this->m_node_array).super_cbtAlignedObjectArray<BT_QUANTIZED_BVH_NODE>.m_data;
      if (ptr != (BT_QUANTIZED_BVH_NODE *)0x0) {
        if ((this->m_node_array).super_cbtAlignedObjectArray<BT_QUANTIZED_BVH_NODE>.m_ownsMemory ==
            true) {
          cbtAlignedFreeInternal(ptr);
        }
        (this->m_node_array).super_cbtAlignedObjectArray<BT_QUANTIZED_BVH_NODE>.m_data =
             (BT_QUANTIZED_BVH_NODE *)0x0;
      }
      (this->m_node_array).super_cbtAlignedObjectArray<BT_QUANTIZED_BVH_NODE>.m_ownsMemory = true;
      (this->m_node_array).super_cbtAlignedObjectArray<BT_QUANTIZED_BVH_NODE>.m_data = pBVar6;
      (this->m_node_array).super_cbtAlignedObjectArray<BT_QUANTIZED_BVH_NODE>.m_capacity = iVar10;
    }
    if (iVar4 < iVar10) {
      lVar7 = (long)iVar10 - (long)iVar4;
      piVar9 = &(this->m_node_array).super_cbtAlignedObjectArray<BT_QUANTIZED_BVH_NODE>.m_data
                [iVar4].m_escapeIndexOrDataIndex;
      do {
        *piVar9 = 0;
        piVar9 = piVar9 + 4;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
    }
  }
  (this->m_node_array).super_cbtAlignedObjectArray<BT_QUANTIZED_BVH_NODE>.m_size = iVar10;
  _build_sub_tree(this,primitive_boxes,0,
                  (primitive_boxes->super_cbtAlignedObjectArray<GIM_BVH_DATA>).m_size);
  return;
}

Assistant:

void cbtQuantizedBvhTree::build_tree(
	GIM_BVH_DATA_ARRAY& primitive_boxes)
{
	calc_quantization(primitive_boxes);
	// initialize node count to 0
	m_num_nodes = 0;
	// allocate nodes
	m_node_array.resize(primitive_boxes.size() * 2);

	_build_sub_tree(primitive_boxes, 0, primitive_boxes.size());
}